

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

bool qUnregisterResourceData(int version,uchar *tree,uchar *name,uchar *data)

{
  QAtomicInt *pQVar1;
  QResourceRoot **ppQVar2;
  Data **ppDVar3;
  Type *this;
  Type *pTVar4;
  ResourceList *this_00;
  QResourceRoot **ppQVar5;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *old;
  long lVar6;
  QResourceRoot *pQVar7;
  long lVar8;
  QResourceRoot **__src;
  undefined4 in_register_0000003c;
  int iVar9;
  bool bVar10;
  QDeadlineTimer timeout;
  
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    bVar10 = false;
  }
  else {
    this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>::
           operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                       *)CONCAT44(in_register_0000003c,version));
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    pTVar4 = this;
    QRecursiveMutex::tryLock(&this->resourceMutex,timeout);
    bVar10 = version - 1U < 3;
    if ((bVar10) &&
       (pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                 ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                               *)pTVar4), (pTVar4->resourceList).d.size != 0)) {
      this_00 = &pTVar4->resourceList;
      lVar8 = 0;
      iVar9 = 0;
      do {
        ppQVar5 = (pTVar4->resourceList).d.ptr;
        pQVar7 = ppQVar5[lVar8];
        if ((((pQVar7->tree == tree) && (pQVar7->names == name)) && (pQVar7->payloads == data)) &&
           (pQVar7->version == version)) {
          old = (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)(this_00->d).d;
          if ((old == (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)0x0) ||
             (1 < *(int *)&old->d)) {
            QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
                      (&this_00->d,GrowsAtEnd,0,old);
            old = (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
                  (pTVar4->resourceList).d.d;
            ppQVar5 = (pTVar4->resourceList).d.ptr;
            pQVar7 = ppQVar5[lVar8];
            if (old != (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)0x0)
            goto LAB_00251d73;
LAB_00251d7a:
            QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
                      (&this_00->d,GrowsAtEnd,0,old);
            ppQVar5 = (pTVar4->resourceList).d.ptr;
          }
          else {
LAB_00251d73:
            ppDVar3 = &old->d;
            old = (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
                  (ulong)*(uint *)ppDVar3;
            if (1 < (int)*(uint *)ppDVar3) goto LAB_00251d7a;
          }
          __src = ppQVar5 + lVar8 + 1;
          lVar6 = (pTVar4->resourceList).d.size;
          ppQVar2 = ppQVar5 + lVar6;
          if ((iVar9 == 0) && (__src != ppQVar2)) {
            (pTVar4->resourceList).d.ptr = __src;
          }
          else if (__src != ppQVar2) {
            memmove(ppQVar5 + lVar8,__src,(long)ppQVar2 - (long)__src);
            lVar6 = (pTVar4->resourceList).d.size;
          }
          (pTVar4->resourceList).d.size = lVar6 + -1;
          LOCK();
          pQVar1 = &pQVar7->ref;
          (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (pQVar7 != (QResourceRoot *)0x0 &&
              (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*pQVar7->_vptr_QResourceRoot[1])(pQVar7);
          }
        }
        else {
          iVar9 = iVar9 + 1;
        }
        lVar8 = (long)iVar9;
      } while (lVar8 < (pTVar4->resourceList).d.size);
    }
    QRecursiveMutex::unlock(&this->resourceMutex);
  }
  return bVar10;
}

Assistant:

Q_CORE_EXPORT bool qUnregisterResourceData(int version, const unsigned char *tree,
                                           const unsigned char *name, const unsigned char *data)
{
    if (resourceGlobalData.isDestroyed())
        return false;

    const auto locker = qt_scoped_lock(resourceMutex());
    if (version >= 0x01 && version <= 0x3) {
        QResourceRoot res(version, tree, name, data);
        ResourceList *list = resourceList();
        for (int i = 0; i < list->size();) {
            if (*list->at(i) == res) {
                QResourceRoot *root = list->takeAt(i);
                if (!root->ref.deref())
                    delete root;
            } else {
                ++i;
            }
        }
        return true;
    }
    return false;
}